

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int binsertblk(bstring b,int pos,void *blk,int len,uchar fill)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void *local_40;
  uchar *aux;
  int l;
  int d;
  uchar fill_local;
  int len_local;
  void *blk_local;
  int pos_local;
  bstring b_local;
  
  if (((((b == (bstring)0x0) || (blk == (void *)0x0)) || (pos < 0)) || ((len < 0 || (b->slen < 0))))
     || ((b->mlen < 1 || (b->mlen < b->slen)))) {
    b_local._4_4_ = -1;
  }
  else {
    uVar1 = b->slen + len;
    uVar2 = pos + len;
    if ((int)(uVar1 | uVar2) < 0) {
      b_local._4_4_ = -1;
    }
    else {
      local_40 = blk;
      if ((b->data <= (uchar *)((long)blk + (long)len)) && (blk < b->data + b->mlen)) {
        local_40 = malloc((long)len);
        if (local_40 == (void *)0x0) {
          return -1;
        }
        memcpy(local_40,blk,(long)len);
      }
      if ((int)uVar1 < (int)uVar2) {
        iVar3 = balloc(b,uVar2 + 1);
        if (iVar3 != 0) {
          if (local_40 != blk) {
            free(local_40);
          }
          return -1;
        }
        memset(b->data + b->slen,(uint)fill,(long)(pos - b->slen));
        b->slen = uVar2;
      }
      else {
        iVar3 = balloc(b,uVar1 + 1);
        if (iVar3 != 0) {
          if (local_40 != blk) {
            free(local_40);
          }
          return -1;
        }
        if (0 < (int)(uVar1 - uVar2)) {
          memmove(b->data + (int)uVar2,b->data + pos,(long)(int)(uVar1 - uVar2));
        }
        b->slen = uVar1;
      }
      if (0 < len) {
        memmove(b->data + pos,local_40,(long)len);
      }
      b->data[b->slen] = '\0';
      if (local_40 != blk) {
        free(local_40);
      }
      b_local._4_4_ = 0;
    }
  }
  return b_local._4_4_;
}

Assistant:

int binsertblk (bstring b, int pos, const void * blk, int len,
                unsigned char fill) {
int d, l;
unsigned char* aux = (unsigned char*) blk;

	if (b == NULL || blk == NULL || pos < 0 || len < 0 || b->slen < 0 ||
	    b->mlen <= 0 || b->mlen < b->slen) return BSTR_ERR;

	/* Compute the two possible end pointers */
	d = b->slen + len;
	l = pos + len;
	if ((d|l) < 0) return BSTR_ERR; /* Integer wrap around. */

	/* Aliasing case */
	if (((size_t) ((unsigned char*) blk + len)) >= ((size_t) b->data) &&
		((size_t) blk) < ((size_t) (b->data + b->mlen))) {
		if (NULL == (aux = (unsigned char*) bstr__alloc (len)))
			return BSTR_ERR;
		bstr__memcpy (aux, blk, len);
	}

	if (l > d) {
		/* Inserting past the end of the string */
		if (balloc (b, l + 1) != BSTR_OK) {
			if (aux != (unsigned char*) blk) bstr__free (aux);
			return BSTR_ERR;
		}
		bstr__memset (b->data + b->slen, (int) fill,
		              (size_t) (pos - b->slen));
		b->slen = l;
	} else {
		/* Inserting in the middle of the string */
		if (balloc (b, d + 1) != BSTR_OK) {
			if (aux != (unsigned char*) blk) bstr__free (aux);
			return BSTR_ERR;
		}
		bBlockCopy (b->data + l, b->data + pos, d - l);
		b->slen = d;
	}
	bBlockCopy (b->data + pos, aux, len);
	b->data[b->slen] = (unsigned char) '\0';
	if (aux != (unsigned char*) blk) bstr__free (aux);
	return BSTR_OK;
}